

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O2

Unm_Man_t * Unm_ManAlloc(Gia_Man_t *pGia)

{
  int nObjsMax;
  Unm_Man_t *pUVar1;
  abctime aVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Hash_IntMan_t *pHVar4;
  Vec_Int_t *pVVar5;
  Gia_Man_t *pGVar6;
  
  pUVar1 = (Unm_Man_t *)calloc(1,0x48);
  aVar2 = Abc_Clock();
  pUVar1->clkStart = aVar2;
  nObjsMax = (pGia->nObjs * 3) / 2;
  pUVar1->nNewSize = nObjsMax;
  pUVar1->pGia = pGia;
  p = Gia_ManStart(nObjsMax);
  pUVar1->pNew = p;
  pcVar3 = Abc_UtilStrsav(pGia->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pGia->pSpec);
  p->pSpec = pcVar3;
  Gia_ManHashAlloc(p);
  Gia_ManCleanLevels(p,nObjsMax);
  p->nObjs = nObjsMax;
  pGVar6 = p;
  Gia_ManIncrementTravId(p);
  p->nObjs = 1;
  pHVar4 = Hash_IntManStart((int)pGVar6);
  pUVar1->pHash = pHVar4;
  pVVar5 = Vec_IntStart(10);
  pUVar1->vLeaves = pVVar5;
  return pUVar1;
}

Assistant:

Unm_Man_t * Unm_ManAlloc( Gia_Man_t * pGia )
{
    Unm_Man_t * p;
    p = ABC_CALLOC( Unm_Man_t, 1 );
    p->clkStart    = Abc_Clock();
    p->nNewSize    = 3 * Gia_ManObjNum(pGia) / 2;
    p->pGia        = pGia;
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start hashing
    p->pHash = Hash_IntManStart( 1000 );
    // truth tables
    p->vLeaves = Vec_IntStart( 10 );
    return p;
}